

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TType::shallowCopy(TType *this,TType *copyOf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  TQualifier *pTVar7;
  TQualifier *pTVar8;
  
  uVar1 = CONCAT31((int3)((uint)*(undefined4 *)&this->field_0x8 >> 8),copyOf->field_0x8);
  *(uint *)&this->field_0x8 = uVar1;
  this->sampler = copyOf->sampler;
  pTVar7 = &copyOf->qualifier;
  pTVar8 = &this->qualifier;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pTVar8->semanticName = pTVar7->semanticName;
    pTVar7 = (TQualifier *)&pTVar7->field_0x8;
    pTVar8 = (TQualifier *)&pTVar8->field_0x8;
  }
  uVar2 = *(uint *)&copyOf->field_0x8 & 0xf00;
  *(uint *)&this->field_0x8 = uVar1 & 0xfffff0ff | uVar2;
  uVar3 = *(uint *)&copyOf->field_0x8 & 0xf000;
  *(uint *)&this->field_0x8 = uVar1 & 0xffff00ff | uVar2 | uVar3;
  uVar4 = *(uint *)&copyOf->field_0x8 & 0xf0000;
  *(uint *)&this->field_0x8 = uVar1 & 0xfff000ff | uVar2 | uVar3 | uVar4;
  *(uint *)&this->field_0x8 =
       uVar1 & 0xffe000ff | uVar2 | uVar3 | uVar4 | *(uint *)&copyOf->field_0x8 & 0x100000;
  this->arraySizes = copyOf->arraySizes;
  this->fieldName = copyOf->fieldName;
  this->typeName = copyOf->typeName;
  (*this->_vptr_TType[0x25])(this);
  this->field_13 = copyOf->field_13;
  this->typeParameters = copyOf->typeParameters;
  this->spirvType = copyOf->spirvType;
  uVar2 = *(uint *)&copyOf->field_0x8 & 0x200000;
  uVar1 = *(uint *)&this->field_0x8;
  *(uint *)&this->field_0x8 = uVar1 & 0xffdfffff | uVar2;
  uVar3 = *(uint *)&copyOf->field_0x8 & 0x400000;
  *(uint *)&this->field_0x8 = uVar1 & 0xff9fffff | uVar2 | uVar3;
  uVar4 = *(uint *)&copyOf->field_0x8 & 0x3800000;
  *(uint *)&this->field_0x8 = uVar1 & 0xfc1fffff | uVar2 | uVar3 | uVar4;
  uVar5 = *(uint *)&copyOf->field_0x8 & 0x4000000;
  *(uint *)&this->field_0x8 = uVar1 & 0xf81fffff | uVar2 | uVar3 | uVar4 | uVar5;
  *(uint *)&this->field_0x8 =
       uVar1 & 0xf01fffff | uVar2 | uVar3 | uVar4 | uVar5 | *(uint *)&copyOf->field_0x8 & 0x8000000;
  return;
}

Assistant:

void shallowCopy(const TType& copyOf)
    {
        basicType = copyOf.basicType;
        sampler = copyOf.sampler;
        qualifier = copyOf.qualifier;
        vectorSize = copyOf.vectorSize;
        matrixCols = copyOf.matrixCols;
        matrixRows = copyOf.matrixRows;
        vector1 = copyOf.vector1;
        arraySizes = copyOf.arraySizes;  // copying the pointer only, not the contents
        fieldName = copyOf.fieldName;
        typeName = copyOf.typeName;
        if (isStruct()) {
            structure = copyOf.structure;
        } else {
            referentType = copyOf.referentType;
        }
        typeParameters = copyOf.typeParameters;
        spirvType = copyOf.spirvType;
        coopmatNV = copyOf.isCoopMatNV();
        coopmatKHR = copyOf.isCoopMatKHR();
        coopmatKHRuse = copyOf.coopmatKHRuse;
        coopmatKHRUseValid = copyOf.coopmatKHRUseValid;
        coopvecNV = copyOf.isCoopVecNV();
    }